

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O0

void __thiscall QHostInfo::QHostInfo(QHostInfo *this,int id)

{
  void *pvVar1;
  QHostInfoPrivate *pQVar2;
  int in_ESI;
  undefined8 *in_RDI;
  QHostInfoPrivate *d;
  QHostInfoPrivate *in_stack_ffffffffffffffe8;
  
  pvVar1 = operator_new(0x58);
  QHostInfoPrivate::QHostInfoPrivate(in_stack_ffffffffffffffe8);
  *in_RDI = pvVar1;
  pQVar2 = d_func((QHostInfo *)0x21d552);
  pQVar2->lookupId = in_ESI;
  return;
}

Assistant:

QHostInfo::QHostInfo(int id)
    : d_ptr(new QHostInfoPrivate)
{
    Q_D(QHostInfo);
    d->lookupId = id;
}